

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O2

int __thiscall VPLGrammar::Parser::RelationalExpressionNode::GetType(RelationalExpressionNode *this)

{
  return 0x25;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                for (size_t i = 2; i < children_.size(); i += 2) {
                    children_[i]->BuildProgram(scope, out);
                    out << "    ";
                    switch(children_[i - 1]->GetType()) {
                        case kLessOrEqualOpType:
                            out << "    cle\n";
                            break;
                        case kGreaterOrEqualOpType:
                            out << "    cge\n";
                            break;
                        case kLessOpType:
                            out << "    clt\n";
                            break;
                        case kGreaterOpType:
                            out << "    cgt\n";
                            break;
                    }
                    out << '\n';
                    scope->Pop();
                }
            }